

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  char *pcVar1;
  int s;
  int s_00;
  anon_class_8_1_ba1d7991 local_40;
  LogMessageFatal local_38 [16];
  
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  s = ((int)pcVar1 - (int)ptr) + 0x10;
  local_40.str = str;
  while( true ) {
    s_00 = size - s;
    if (s_00 == 0 || size < s) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,0x183,0x11,"size > chunk_size");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    AppendStringFallback::anon_class_8_1_ba1d7991::operator()(&local_40,ptr,s);
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar1 = Next(this);
    if (pcVar1 == (char *)0x0) break;
    ptr = pcVar1 + 0x10;
    s = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    size = s_00;
    if (s_00 <= s) {
      AppendStringFallback::anon_class_8_1_ba1d7991::operator()(&local_40,ptr,s_00);
      return ptr + s_00;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}